

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

int INT_EVmaster_assign_canonical_name(EVmaster master,char *given_name,char *canonical_name)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  timespec ts;
  
  lVar6 = 0;
  for (uVar7 = 0; (long)uVar7 < (long)master->node_count; uVar7 = uVar7 + 1) {
    if (*(char **)((long)&master->nodes->name + lVar6) == given_name) {
      if ((master->dfg == (EVdfg)0x0) || (master->dfg->realized != 1)) {
        iVar2 = CMtrace_val[0xd];
        if (master->cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(master->cm,EVdfgVerbose);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = (FILE *)master->cm->CMTrace_file;
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)master->cm->CMTrace_file,
                  "Canonical name assignment, node = %d, given name was %s, canonical is %s\n",
                  uVar7 & 0xffffffff,given_name,canonical_name);
        }
      }
      else {
        iVar2 = CMtrace_val[0xd];
        if (master->cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(master->cm,EVdfgVerbose);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = (FILE *)master->cm->CMTrace_file;
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)master->cm->CMTrace_file,
                  "Reconfigure canonical name assignment, node = %d\n",uVar7 & 0xffffffff);
        }
      }
      fflush((FILE *)master->cm->CMTrace_file);
      pcVar5 = strdup(canonical_name);
      *(char **)((long)&master->nodes->canonical_name + lVar6) = pcVar5;
    }
    lVar6 = lVar6 + 0x38;
  }
  return 1;
}

Assistant:

extern int
INT_EVmaster_assign_canonical_name(EVmaster master, char *given_name, char *canonical_name)
{
    int node;
    for (node = 0; node < master->node_count; node++) {
	if (master->nodes[node].name == given_name) {
	    if (master->dfg && (master->dfg->realized == 1)) {
		CMtrace_out(master->cm, EVdfgVerbose, "Reconfigure canonical name assignment, node = %d\n", node);
	    } else {
		CMtrace_out(master->cm, EVdfgVerbose, "Canonical name assignment, node = %d, given name was %s, canonical is %s\n", node, given_name, canonical_name);
	    }
	    master->nodes[node].canonical_name = strdup(canonical_name);
	}
    }
    return 1;
}